

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O1

bool peparse::parse_resource_id(bounded_buffer *data,uint32_t id,string *result)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint16_t len;
  UCharString rawString;
  char16_t c;
  ushort local_7a;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_78;
  string *local_58;
  string local_50;
  
  bVar1 = readWord(data,id,&local_7a);
  if (bVar1) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = L'\0';
    bVar1 = local_7a == 0;
    local_58 = result;
    if (!bVar1) {
      uVar3 = 0;
      do {
        bVar2 = readChar16(data,id + 2 + uVar3,(char16_t *)&local_50);
        if (!bVar2) goto LAB_0011013d;
        std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
        ::push_back(&local_78,(char16_t)local_50._M_dataplus._M_p);
        if (!bVar2) goto LAB_0011013d;
        uVar3 = uVar3 + 2;
        bVar2 = uVar3 < (uint)local_7a * 2;
        bVar1 = !bVar2;
      } while (bVar2);
    }
    from_utf16(&local_50,&local_78);
    std::__cxx11::string::operator=((string *)local_58,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT62(local_50._M_dataplus._M_p._2_6_,(char16_t)local_50._M_dataplus._M_p) !=
        &local_50.field_2) {
      operator_delete((undefined1 *)
                      CONCAT62(local_50._M_dataplus._M_p._2_6_,(char16_t)local_50._M_dataplus._M_p),
                      local_50.field_2._M_allocated_capacity + 1);
    }
LAB_0011013d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT62(local_78.field_2._M_allocated_capacity._2_6_,
                               local_78.field_2._M_local_buf[0]) * 2 + 2);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool parse_resource_id(bounded_buffer *data,
                       std::uint32_t id,
                       std::string &result) {
  std::uint16_t len;
  if (!readWord(data, id, len)) {
    return false;
  }
  id += 2;

  std::uint32_t rawSize = len * 2U;
  UCharString rawString;
  for (std::uint32_t i = 0; i < rawSize; i += 2) {
    char16_t c;
    if (!readChar16(data, id + i, c)) {
      return false;
    }
    rawString.push_back(c);
  }

  result = from_utf16(rawString);
  return true;
}